

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx_decompress.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *path;
  char *path_00;
  bool bVar1;
  string_view local_88;
  string local_78 [8];
  string decompressed;
  string local_48 [8];
  string raw;
  char *output_file;
  char *input_file;
  char **argv_local;
  int argc_local;
  
  if (argc == 3) {
    path = argv[1];
    path_00 = argv[2];
    std::__cxx11::string::string(local_48);
    bVar1 = mg::fs::read_file(path,(string *)local_48);
    if (bVar1) {
      std::__cxx11::string::string(local_78);
      local_88 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
      bVar1 = mg::data::nxx_decompress(&local_88,(string *)local_78);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        bVar1 = mg::fs::write_file(path_00,(string *)local_78);
        if (bVar1) {
          argv_local._4_4_ = 0;
        }
        else {
          argv_local._4_4_ = -1;
        }
      }
      else {
        fprintf(_stderr,"Failed to decompress\n");
        argv_local._4_4_ = -1;
      }
      std::__cxx11::string::~string(local_78);
    }
    else {
      argv_local._4_4_ = -1;
    }
    std::__cxx11::string::~string(local_48);
  }
  else {
    fprintf(_stderr,"%s input output\n",*argv);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 3) {
    fprintf(stderr, "%s input output\n", argv[0]);
    return -1;
  }

  // Name args
  const char *input_file = argv[1];
  const char *output_file = argv[2];

  // Read raw input data
  std::string raw;
  if (!mg::fs::read_file(input_file, raw)) {
    return -1;
  }

  // Decompress
  std::string decompressed;
  if (!mg::data::nxx_decompress(raw, decompressed)) {
    fprintf(stderr, "Failed to decompress\n");
    return -1;
  }

  // Write
  if (!mg::fs::write_file(output_file, decompressed)) {
    return -1;
  }

  return 0;
}